

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_signal_foreach_signal(event_base *base,evmap_signal_foreach_signal_cb fn,void *arg)

{
  evmap_signal *peVar1;
  evmap_signal *ctx;
  int signum;
  int r;
  event_signal_map *sigmap;
  void *arg_local;
  evmap_signal_foreach_signal_cb fn_local;
  event_base *base_local;
  
  ctx._4_4_ = 0;
  ctx._0_4_ = 0;
  while (((int)ctx < (base->sigmap).nentries &&
         ((peVar1 = (evmap_signal *)(base->sigmap).entries[(int)ctx], peVar1 == (evmap_signal *)0x0
          || (ctx._4_4_ = (*fn)(base,(int)ctx,peVar1,arg), ctx._4_4_ == 0))))) {
    ctx._0_4_ = (int)ctx + 1;
  }
  return ctx._4_4_;
}

Assistant:

static int
evmap_signal_foreach_signal(struct event_base *base,
    evmap_signal_foreach_signal_cb fn,
    void *arg)
{
	struct event_signal_map *sigmap = &base->sigmap;
	int r = 0;
	int signum;

	for (signum = 0; signum < sigmap->nentries; ++signum) {
		struct evmap_signal *ctx = sigmap->entries[signum];
		if (!ctx)
			continue;
		if ((r = fn(base, signum, ctx, arg)))
			break;
	}
	return r;
}